

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polysolver.h
# Opt level: O1

vector<double,_std::allocator<double>_> *
Poly_Solver::poly_solve
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *v,double l,double r,double eps)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pointer pdVar6;
  pointer pdVar7;
  iterator __position;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [32];
  ulong uVar15;
  undefined1 auVar16 [16];
  iterator __begin3;
  result_type rVar17;
  pointer pdVar18;
  uint uVar19;
  const_iterator __end1;
  long lVar20;
  int iVar21;
  ulong uVar22;
  const_iterator __end1_1;
  pointer pdVar23;
  pointer pdVar24;
  int iVar25;
  vector<double,_std::allocator<double>_> *__range1;
  uint uVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 in_XMM6 [16];
  double g;
  vector<double,_std::allocator<double>_> nx;
  double local_a0;
  allocator_type local_91;
  double local_90;
  vector<double,std::allocator<double>> *local_88;
  double local_80;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_58;
  double local_40;
  double local_38;
  
  local_90 = l;
  local_80 = r;
  local_40 = eps;
  if (poly_solve(std::vector<double,std::allocator<double>>,double,double,double)::rng == '\0') {
    poly_solve();
  }
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = local_80 - local_90;
  uVar26 = 0;
  iVar25 = 0;
  pdVar18 = (pointer)0x0;
  local_88 = (vector<double,std::allocator<double>> *)__return_storage_ptr__;
  do {
    pdVar6 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar23 = pdVar18;
    if ((ulong)((long)pdVar7 - (long)pdVar6) < 9) break;
    auVar36 = ZEXT864(0) << 0x40;
    auVar28 = auVar36._0_16_;
    if (pdVar6 != pdVar7) {
      auVar40._8_8_ = 0x7fffffffffffffff;
      auVar40._0_8_ = 0x7fffffffffffffff;
      pdVar23 = pdVar6;
      do {
        auVar28._8_8_ = 0;
        auVar28._0_8_ = *pdVar23;
        auVar28 = vandpd_avx(auVar28,auVar40);
        auVar28 = vmaxsd_avx(auVar28,auVar36._0_16_);
        auVar36 = ZEXT1664(auVar28);
        pdVar23 = pdVar23 + 1;
      } while (pdVar23 != pdVar7);
    }
    auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    if (pdVar6 != pdVar7 && auVar28._0_8_ != 0.0) {
      auVar29 = vpbroadcastq_avx512f();
      auVar29 = vpsrlq_avx512f(auVar29,3);
      auVar30 = vbroadcastsd_avx512f(auVar28);
      uVar22 = 0;
      do {
        auVar31 = vpbroadcastq_avx512f();
        auVar31 = vporq_avx512f(auVar31,auVar36);
        uVar15 = vpcmpuq_avx512f(auVar31,auVar29,2);
        pdVar23 = pdVar6 + uVar22;
        auVar31._8_8_ = (ulong)((byte)(uVar15 >> 1) & 1) * (long)pdVar23[1];
        auVar31._0_8_ = (ulong)((byte)uVar15 & 1) * (long)*pdVar23;
        auVar31._16_8_ = (ulong)((byte)(uVar15 >> 2) & 1) * (long)pdVar23[2];
        auVar31._24_8_ = (ulong)((byte)(uVar15 >> 3) & 1) * (long)pdVar23[3];
        auVar31._32_8_ = (ulong)((byte)(uVar15 >> 4) & 1) * (long)pdVar23[4];
        auVar31._40_8_ = (ulong)((byte)(uVar15 >> 5) & 1) * (long)pdVar23[5];
        auVar31._48_8_ = (ulong)((byte)(uVar15 >> 6) & 1) * (long)pdVar23[6];
        auVar31._56_8_ = (uVar15 >> 7) * (long)pdVar23[7];
        auVar31 = vdivpd_avx512f(auVar31,auVar30);
        pdVar23 = pdVar6 + uVar22;
        bVar27 = (bool)((byte)uVar15 & 1);
        bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar15 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar15 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar15 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar15 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
        *pdVar23 = (double)((ulong)bVar27 * auVar31._0_8_ | (ulong)!bVar27 * (long)*pdVar23);
        pdVar23[1] = (double)((ulong)bVar8 * auVar31._8_8_ | (ulong)!bVar8 * (long)pdVar23[1]);
        pdVar23[2] = (double)((ulong)bVar9 * auVar31._16_8_ | (ulong)!bVar9 * (long)pdVar23[2]);
        pdVar23[3] = (double)((ulong)bVar10 * auVar31._24_8_ | (ulong)!bVar10 * (long)pdVar23[3]);
        pdVar23[4] = (double)((ulong)bVar11 * auVar31._32_8_ | (ulong)!bVar11 * (long)pdVar23[4]);
        pdVar23[5] = (double)((ulong)bVar12 * auVar31._40_8_ | (ulong)!bVar12 * (long)pdVar23[5]);
        pdVar23[6] = (double)((ulong)bVar13 * auVar31._48_8_ | (ulong)!bVar13 * (long)pdVar23[6]);
        pdVar23[7] = (double)((uVar15 >> 7) * auVar31._56_8_ |
                             (ulong)!SUB81(uVar15 >> 7,0) * (long)pdVar23[7]);
        uVar22 = uVar22 + 8;
      } while (((((long)pdVar7 - (long)pdVar6) - 8U >> 3) + 8 & 0xfffffffffffffff8) != uVar22);
    }
    std::vector<double,_std::allocator<double>_>::vector(&local_78,v);
    pdVar23 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar21 = (int)((ulong)((long)local_78.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start) >> 3);
    auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar41._8_4_ = 8;
    auVar41._0_8_ = 0x800000008;
    auVar41._12_4_ = 8;
    auVar41._16_4_ = 8;
    auVar41._20_4_ = 8;
    auVar41._24_4_ = 8;
    auVar41._28_4_ = 8;
    if (1 < iVar21) {
      auVar29 = vpbroadcastq_avx512f();
      uVar22 = 0;
      auVar14 = vpmovsxbd_avx2(ZEXT816(0x807060504030201));
      do {
        auVar30 = vpbroadcastq_avx512f();
        auVar30 = vporq_avx512f(auVar30,auVar36);
        uVar15 = vpcmpuq_avx512f(auVar30,auVar29,2);
        auVar30 = vcvtudq2pd_avx512f(auVar14);
        pdVar6 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar22 + 1;
        auVar32._8_8_ = (ulong)((byte)(uVar15 >> 1) & 1) * (long)pdVar6[1];
        auVar32._0_8_ = (ulong)((byte)uVar15 & 1) * (long)*pdVar6;
        auVar32._16_8_ = (ulong)((byte)(uVar15 >> 2) & 1) * (long)pdVar6[2];
        auVar32._24_8_ = (ulong)((byte)(uVar15 >> 3) & 1) * (long)pdVar6[3];
        auVar32._32_8_ = (ulong)((byte)(uVar15 >> 4) & 1) * (long)pdVar6[4];
        auVar32._40_8_ = (ulong)((byte)(uVar15 >> 5) & 1) * (long)pdVar6[5];
        auVar32._48_8_ = (ulong)((byte)(uVar15 >> 6) & 1) * (long)pdVar6[6];
        auVar32._56_8_ = (uVar15 >> 7) * (long)pdVar6[7];
        auVar30 = vmulpd_avx512f(auVar32,auVar30);
        pdVar6 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar22;
        bVar27 = (bool)((byte)uVar15 & 1);
        bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar15 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar15 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar15 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar15 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
        *pdVar6 = (double)((ulong)bVar27 * auVar30._0_8_ | (ulong)!bVar27 * (long)*pdVar6);
        pdVar6[1] = (double)((ulong)bVar8 * auVar30._8_8_ | (ulong)!bVar8 * (long)pdVar6[1]);
        pdVar6[2] = (double)((ulong)bVar9 * auVar30._16_8_ | (ulong)!bVar9 * (long)pdVar6[2]);
        pdVar6[3] = (double)((ulong)bVar10 * auVar30._24_8_ | (ulong)!bVar10 * (long)pdVar6[3]);
        pdVar6[4] = (double)((ulong)bVar11 * auVar30._32_8_ | (ulong)!bVar11 * (long)pdVar6[4]);
        pdVar6[5] = (double)((ulong)bVar12 * auVar30._40_8_ | (ulong)!bVar12 * (long)pdVar6[5]);
        pdVar6[6] = (double)((ulong)bVar13 * auVar30._48_8_ | (ulong)!bVar13 * (long)pdVar6[6]);
        pdVar6[7] = (double)((uVar15 >> 7) * auVar30._56_8_ |
                            (ulong)!SUB81(uVar15 >> 7,0) * (long)pdVar6[7]);
        uVar22 = uVar22 + 8;
        auVar14 = vpaddd_avx2(auVar14,auVar41);
      } while (((ulong)(iVar21 - 1) + 7 & 0xfffffffffffffff8) != uVar22);
    }
    if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish !=
        local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start) {
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
    }
    pdVar6 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pdVar18 != (pointer)0x0) {
      operator_delete(pdVar18);
    }
    if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    rVar17 = std::
             mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             ::operator()(&poly_solve::rng);
    auVar28 = vcvtusi2sd_avx512f(in_XMM6,rVar17);
    auVar34._0_8_ = (double)(float)(auVar28._0_8_ / 4294967295.0);
    auVar34._8_8_ = auVar28._8_8_;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = local_38;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_90;
    auVar28 = vfmadd213sd_fma(auVar34,auVar38,auVar1);
    uVar26 = uVar26 + 1;
    dVar33 = local_80;
    if ((uVar26 % 5 == 1) || (dVar33 = local_90, local_a0 = auVar28._0_8_, uVar26 % 5 == 0)) {
      local_a0 = dVar33;
    }
    pdVar18 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar7 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar19 = 1;
    do {
      dVar37 = 0.0;
      auVar36 = ZEXT864(0) << 0x40;
      dVar33 = 0.0;
      if (pdVar18 != pdVar7) {
        auVar29 = ZEXT1664(ZEXT816(0x3ff0000000000000));
        pdVar24 = pdVar18;
        do {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *pdVar24;
          auVar28 = vfmadd231sd_fma(auVar36._0_16_,auVar29._0_16_,auVar2);
          auVar36 = ZEXT1664(auVar28);
          dVar33 = auVar28._0_8_;
          auVar29 = ZEXT864((ulong)(local_a0 * auVar29._0_8_));
          pdVar24 = pdVar24 + 1;
        } while (pdVar24 != pdVar7);
      }
      if (pdVar23 != pdVar6) {
        auVar36 = ZEXT864(0) << 0x40;
        auVar29 = ZEXT1664(ZEXT816(0x3ff0000000000000));
        pdVar24 = pdVar23;
        do {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *pdVar24;
          auVar28 = vfmadd231sd_fma(auVar36._0_16_,auVar29._0_16_,auVar3);
          auVar36 = ZEXT1664(auVar28);
          dVar37 = auVar28._0_8_;
          auVar29 = ZEXT864((ulong)(local_a0 * auVar29._0_8_));
          pdVar24 = pdVar24 + 1;
        } while (pdVar24 != pdVar6);
      }
      local_a0 = local_a0 - dVar33 / dVar37;
    } while (((-10000000000.0 <= local_a0) && (local_a0 <= 10000000000.0)) &&
            (bVar27 = uVar19 < 0x1e, uVar19 = uVar19 + 1, bVar27));
    if ((local_a0 < -10000000000.0) || (10000000000.0 < local_a0)) {
      iVar25 = iVar25 + 1;
    }
    else {
      pdVar18 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pdVar6 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      auVar28 = ZEXT816(0);
      if (pdVar18 != pdVar6) {
        auVar36 = ZEXT1664(ZEXT816(0x3ff0000000000000));
        do {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *pdVar18;
          auVar28 = vfmadd231sd_fma(auVar28,auVar36._0_16_,auVar4);
          auVar36 = ZEXT864((ulong)(local_a0 * auVar36._0_8_));
          pdVar18 = pdVar18 + 1;
        } while (pdVar18 != pdVar6);
      }
      auVar16._8_8_ = 0x7fffffffffffffff;
      auVar16._0_8_ = 0x7fffffffffffffff;
      auVar28 = vandpd_avx512vl(auVar28,auVar16);
      if (auVar28._0_8_ <= local_40) {
        if ((local_90 <= local_a0) && (local_a0 <= local_80)) {
          __position._M_current = *(double **)(local_88 + 8);
          if (__position._M_current == *(double **)(local_88 + 0x10)) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      (local_88,__position,&local_a0);
          }
          else {
            *__position._M_current = local_a0;
            *(double **)(local_88 + 8) = __position._M_current + 1;
          }
        }
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_58,
                   (long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 3,&local_91);
        pdVar18 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar19 = (uint)((ulong)((long)(v->super__Vector_base<double,_std::allocator<double>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pdVar18) >>
                       3);
        if (1 < (int)uVar19) {
          lVar20 = (ulong)(uVar19 & 0x7fffffff) + 1;
          do {
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar20 + -2] = pdVar18[lVar20 + -2];
            auVar35._8_8_ = 0;
            auVar35._0_8_ = pdVar18[lVar20 + -2];
            auVar39._8_8_ = 0;
            auVar39._0_8_ = local_a0;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = pdVar18[lVar20 + -3];
            auVar28 = vfmadd213sd_fma(auVar39,auVar35,auVar5);
            pdVar18[lVar20 + -3] = auVar28._0_8_;
            lVar20 = lVar20 + -1;
          } while (2 < lVar20);
        }
        pdVar18 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + 1;
        if (pdVar18 !=
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          memmove(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,pdVar18,
                  (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar18);
        }
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + -1;
        std::vector<double,_std::allocator<double>_>::operator=(v,&local_58);
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        iVar25 = 0;
      }
      else {
        iVar25 = iVar25 + 2;
      }
    }
    pdVar18 = pdVar23;
  } while (iVar25 < 0xe);
  if (pdVar23 != (pointer)0x0) {
    operator_delete(pdVar23);
  }
  return (vector<double,_std::allocator<double>_> *)local_88;
}

Assistant:

vector<double> poly_solve(vector<double> v, double l, double r, double eps = 1e-8) {
		static RNG_TYPE rng;
		vector<double> dv, s;
		int retry = 0, tat=0;
		while (v.size() > 1) {
			double mx = 0;
			for (auto t : v) mx = max(mx, fabs(t));
			if (mx)
			{
				for (auto& t : v) t /= mx;
			}
			dv = de(v);
			double g = l + randf(rng) * (r - l);
			++tat;
			if (tat % 5 == 0) g = l;
			else if (tat % 5 == 1) g = r;
			for (int j = 1; j <= 30; ++j) {
				g = g - poly_calc(v, g) / poly_calc(dv, g);
				if (g != g || g > 1e10 || g < -1e10)
					break;
			}
			if (g != g || g > 1e10 || g < -1e10) ++retry;
			else if (fabs(poly_calc(v, g)) > eps) retry += 2;
			else {
				retry = 0;
				if (g >= l && g <= r) s.push_back(g);
				vector<double> nx(v.size());
				//v/(x-g)
				for (int j = (int)v.size() - 1; j >= 1; --j) {
					nx[j] = v[j]; v[j - 1] += v[j] * g;
				}
				nx.erase(nx.begin()); v = nx;
			}
			if (retry >= 14) break;
		}
		return s;
		/*
		if (v.size() == 0)
			return vector<double>();
//		v = poly_normalized(v);
		vector<double> w = poly_solve(de(v), l, r, eps, false), o;
		w.insert(w.begin(), l);
		w.push_back(r);
		for (int j = 0; j + 1 < (int)w.size(); ++j) {
			double a = w[j], b = w[j+1], fa = poly_calc(v, a), fb = poly_calc(v, b);
			if (fabs(fa) < eps) {
				o.push_back(a);
				continue;
			}
			if (fabs(fb) < eps) {
				o.push_back(b);
				continue;
			}
			if ((fa > 0) == (fb > 0))
				continue;
			for (int k = 0; k < 100 && (a!=b); ++k) {
				double m = (a + b) / 2, fm = poly_calc(v, m);
				if ((fa > 0) ^ (fm > 0)) b = m, fb = fm;
				else a = m, fa = fm;
			}
			o.push_back(a);
		}
		if (verify)
		{
			vector<double> oo;
			for (auto g : o)
				if (fabs(poly_calc(v, g)) < eps) oo.push_back(g);
			o = oo;
		}
		return o;*/
	}